

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::compute_order::
init<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
          (compute_order *this,
          solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
          *s,bit_array *x)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  if (this->order - infeasibility_decr < 2) {
    infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>const,baryonyx::bit_array>
              (this,s,x);
    return;
  }
  if (this->order == pi_sign_change) {
    piVar1 = (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar2 = (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    if (piVar1 != piVar2) {
      auVar4 = vpmovsxbd_avx512f(_DAT_00631380);
      auVar5 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar6 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar7 = vpbroadcastd_avx512f(ZEXT416(0x10));
      uVar3 = 0;
      auVar8 = vpbroadcastq_avx512f();
      auVar8 = vpsrlq_avx512f(auVar8,2);
      do {
        auVar9 = vpbroadcastq_avx512f();
        auVar10 = vporq_avx512f(auVar9,auVar5);
        auVar9 = vporq_avx512f(auVar9,auVar6);
        vpcmpuq_avx512f(auVar9,auVar8,2);
        vpcmpuq_avx512f(auVar10,auVar8,2);
        auVar9 = vmovdqu32_avx512f(auVar4);
        *(undefined1 (*) [64])(piVar1 + uVar3) = auVar9;
        uVar3 = uVar3 + 0x10;
        auVar4 = vpaddd_avx512f(auVar4,auVar7);
      } while ((((ulong)((long)piVar2 + (-4 - (long)piVar1)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
               uVar3);
    }
    return;
  }
  compute_violated_constraints<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
            (s,x,&this->R);
  return;
}

Assistant:

void init(const Solver& s, const Xtype& x)
    {
        switch (order) {
        case solver_parameters::constraint_order::infeasibility_decr:
        case solver_parameters::constraint_order::infeasibility_incr:
            infeasibility_local_compute_violated_constraints(s, x);
            break;
        case solver_parameters::constraint_order::pi_sign_change:
            std::iota(R.begin(), R.end(), 0);
            break;
        case solver_parameters::constraint_order::none:
        case solver_parameters::constraint_order::reversing:
        case solver_parameters::constraint_order::random_sorting:
        case solver_parameters::constraint_order::lagrangian_decr:
        case solver_parameters::constraint_order::lagrangian_incr:
        default:
            compute_violated_constraints(s, x, R);
            break;
        }
    }